

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mg_websocket_write(mg_connection *conn,int opcode,char *data,size_t data_len)

{
  uint16_t uVar1;
  uint32_t uVar2;
  long local_10a8;
  size_t copy_len;
  uchar *copy;
  uchar mem [4192];
  size_t data_len_local;
  char *data_local;
  int opcode_local;
  mg_connection *conn_local;
  
  copy_len = (size_t)&copy;
  if ((data_len + 10 < 0x1061) ||
     (copy_len = (size_t)malloc(data_len + 10), (void *)copy_len != (void *)0x0)) {
    *(byte *)copy_len = ((byte)opcode & 0xf) + 0x80;
    if (data_len < 0x7e) {
      *(char *)(copy_len + 1) = (char)data_len;
      memcpy((void *)(copy_len + 2),data,data_len);
      local_10a8 = data_len + 2;
    }
    else if (data_len < 0x10000) {
      *(undefined1 *)(copy_len + 1) = 0x7e;
      uVar1 = htons((uint16_t)data_len);
      *(uint16_t *)(copy_len + 2) = uVar1;
      memcpy((void *)(copy_len + 4),data,data_len);
      local_10a8 = data_len + 4;
    }
    else {
      *(undefined1 *)(copy_len + 1) = 0x7f;
      uVar2 = htonl((uint32_t)(data_len >> 0x20));
      *(uint32_t *)(copy_len + 2) = uVar2;
      uVar2 = htonl((uint32_t)data_len);
      *(uint32_t *)(copy_len + 6) = uVar2;
      memcpy((void *)(copy_len + 10),data,data_len);
      local_10a8 = data_len + 10;
    }
    if (local_10a8 != 0) {
      mg_write(conn,(void *)copy_len,(int)local_10a8);
    }
    if ((uchar **)copy_len != &copy) {
      free((void *)copy_len);
    }
    if (opcode == 8) {
      *(uint *)((long)conn[-1].callback_param + 0x98) =
           *(uint *)((long)conn[-1].callback_param + 0x98) | 1;
    }
    conn_local = *(mg_connection **)((long)conn[-1].callback_param + 0x58);
  }
  else {
    conn_local = (mg_connection *)0x0;
  }
  return (size_t)conn_local;
}

Assistant:

size_t mg_websocket_write(struct mg_connection *conn, int opcode,
                       const char *data, size_t data_len) {
    unsigned char mem[4192], *copy = mem;
    size_t copy_len = 0;

    if (data_len + 10 > sizeof(mem) &&
        (copy = (unsigned char *) malloc(data_len + 10)) == NULL) {
      return 0;
    }

    copy[0] = 0x80 + (opcode & 0x0f);

    // Frame format: http://tools.ietf.org/html/rfc6455#section-5.2
    if (data_len < 126) {
      // Inline 7-bit length field
      copy[1] = data_len;
      memcpy(copy + 2, data, data_len);
      copy_len = 2 + data_len;
    } else if (data_len <= 0xFFFF) {
      // 16-bit length field
      copy[1] = 126;
      * (uint16_t *) (copy + 2) = (uint16_t) htons((uint16_t) data_len);
      memcpy(copy + 4, data, data_len);
      copy_len = 4 + data_len;
    } else {
      // 64-bit length field
      copy[1] = 127;
      * (uint32_t *) (copy + 2) = (uint32_t)
        htonl((uint32_t) ((uint64_t) data_len >> 32));
      * (uint32_t *) (copy + 6) = (uint32_t) htonl(data_len & 0xffffffff);
      memcpy(copy + 10, data, data_len);
      copy_len = 10 + data_len;
    }

    if (copy_len > 0) {
      mg_write(conn, copy, copy_len);
    }
    if (copy != mem) {
      free(copy);
    }

    // If we send closing frame, schedule a connection to be closed after
    // data is drained to the client.
    if (opcode == WEBSOCKET_OPCODE_CONNECTION_CLOSE) {
      MG_CONN_2_CONN(conn)->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    }

    return MG_CONN_2_CONN(conn)->ns_conn->send_iobuf.len;
}